

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<12,_13,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  undefined4 in_register_00000014;
  Matrix<float,_4,_4> *extraout_RDX;
  Matrix<float,_4,_4> *extraout_RDX_00;
  Matrix<float,_4,_4> *mat;
  Matrix<float,_4,_4> *mat_00;
  Type in0;
  MatrixCaseUtils local_11c [12];
  MatrixCaseUtils local_110 [12];
  tcu local_104 [12];
  Mat4 local_f8;
  VecAccess<float,_4,_3> local_b8;
  Matrix<float,_4,_4> local_a0;
  Matrix<float,_4,_4> local_60;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,13>
              (&local_f8,(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type),in_ECX);
    mat = extraout_RDX;
  }
  else {
    tcu::Matrix<float,_4,_4>::Matrix(&local_f8,(float *)sr::(anonymous_namespace)::s_constInMat4x4);
    mat = extraout_RDX_00;
  }
  sr::(anonymous_namespace)::MatrixCaseUtils::decrement<float,4,4>
            (&local_60,(MatrixCaseUtils *)&local_f8,mat);
  reduceToVec3(local_110,&local_60);
  sr::(anonymous_namespace)::MatrixCaseUtils::decrement<float,4,4>
            (&local_a0,(MatrixCaseUtils *)&local_f8,mat_00);
  reduceToVec3(local_11c,&local_a0);
  tcu::operator+(local_104,(Vector<float,_3> *)local_110,(Vector<float,_3> *)local_11c);
  local_b8.m_vector = &evalCtx->color;
  local_b8.m_index[0] = 0;
  local_b8.m_index[1] = 1;
  local_b8.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_b8,(Vector<float,_3> *)local_104);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(in0)) + reduceToVec3(decrement(in0));
	}